

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
nlohmann::
basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
::
get_ref_impl<std::__cxx11::string_const&,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>const>
          (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           *obj)

{
  type_error *__return_storage_ptr__;
  char *pcVar1;
  allocator local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if ((obj->m_type == string) &&
     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(obj->m_value).object !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    return (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (obj->m_value).object;
  }
  __return_storage_ptr__ = (type_error *)__cxa_allocate_exception(0x20);
  if ((ulong)obj->m_type < 9) {
    pcVar1 = (&PTR_anon_var_dwarf_9d2bc_0051f660)[obj->m_type];
  }
  else {
    pcVar1 = "number";
  }
  std::__cxx11::string::string((string *)&local_58,pcVar1,&local_59);
  std::operator+(&local_38,"incompatible ReferenceType for get_ref, actual type is ",&local_58);
  detail::type_error::create(__return_storage_ptr__,0x12f,&local_38);
  __cxa_throw(__return_storage_ptr__,&detail::type_error::typeinfo,detail::exception::~exception);
}

Assistant:

static ReferenceType get_ref_impl(ThisType& obj) {
		// delegate the call to get_ptr<>()
		auto ptr = obj.template get_ptr<typename std::add_pointer<ReferenceType>::type>();

		if (JSON_LIKELY(ptr != nullptr)) {
			return *ptr;
		}

		JSON_THROW(type_error::create(
			303, "incompatible ReferenceType for get_ref, actual type is " + std::string(obj.type_name())));
	}